

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fit-model-multi.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  pointer *this;
  pointer *this_00;
  vector *this_01;
  pointer *ppuVar1;
  float fVar2;
  int width;
  bool bVar3;
  char *pcVar4;
  typed_value<boost::filesystem::path,_char> *ptVar5;
  typed_value<std::vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>,_char>
  *ptVar6;
  basic_command_line_parser<char> *this_02;
  size_type sVar7;
  ostream *poVar8;
  size_type sVar9;
  size_type sVar10;
  void *this_03;
  reference this_04;
  string *psVar11;
  reference pMVar12;
  reference pfVar13;
  reference pvVar14;
  reference pvVar15;
  reference pvVar16;
  reference this_05;
  CoeffReturnType pfVar17;
  PcaModel *pPVar18;
  VectorXf *pVVar19;
  vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *pvVar20;
  vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *pvVar21;
  vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *pvVar22;
  basic_ostream<char,_std::char_traits<char>_> *pbVar23;
  string local_1858;
  vector<float,_std::allocator<float>_> local_1838;
  vector<float,_std::allocator<float>_> local_1820;
  Mesh local_1808;
  path local_1778;
  path local_1758;
  vector<int,_std::allocator<int>_> local_1738;
  core local_1718 [96];
  _InputArray local_16b8;
  path local_16a0;
  Image4u local_1680;
  Texture local_1658;
  Matrix4<float> local_1638;
  undefined1 local_15f0 [8];
  Image4u frontal_rendering;
  vector<float,_std::allocator<float>_> local_15a8;
  undefined1 local_1590 [24];
  Mesh neutral_expression;
  undefined1 local_14e8 [8];
  Matrix4f modelview_frontal;
  vector<int,_std::allocator<int>_> local_1488;
  _InputArray local_1470;
  path local_1458;
  undefined1 local_1438 [8];
  path outputfile;
  vector<int,_std::allocator<int>_> local_13b8;
  _InputArray local_13a0;
  path local_1388;
  core local_1368 [8];
  Mat texturemap_opencv;
  path local_1308;
  vector<int,_std::allocator<int>_> local_12e8;
  core local_12d0 [96];
  _InputArray local_1270;
  path local_1258;
  Texture local_1238;
  Matrix4<float> local_1218;
  undefined1 local_11d0 [8];
  Image4u frontal_rendering_1;
  vector<float,_std::allocator<float>_> local_1188;
  undefined1 local_1170 [24];
  Mesh neutral_expression_1;
  undefined1 local_10c8 [8];
  Matrix4f modelview_frontal_1;
  _InputArray local_1070;
  path local_1058;
  path local_1038;
  undefined1 local_1018 [8];
  path outputfile_1;
  Vector4f local_fd8;
  Matrix4f local_fc8;
  Matrix4f local_f88;
  Mat local_f48 [96];
  Scalar_<double> local_ee8;
  Point_<float> local_ec8;
  Point_ local_ec0 [8];
  Point_<float> local_eb8;
  Point_ local_eb0 [8];
  _InputOutputArray local_ea8;
  reference local_e90;
  Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_> *lm;
  iterator __end2;
  iterator __begin2;
  value_type *__range2;
  Mat outimg;
  Image4u local_e10;
  Matrix4f local_de8;
  Matrix4f local_da8;
  undefined1 local_d68 [8];
  Image4u texturemap;
  uint local_d2c;
  float yaw_angle;
  uint i_1;
  Mat merged_texturemap;
  undefined1 local_cc8 [8];
  WeightedIsomapAveraging texturemap_averaging;
  iterator iStack_bf8;
  float i;
  iterator __end1_3;
  iterator __begin1_3;
  vector<float,_std::allocator<float>_> *__range1_3;
  optional<eos::fitting::RenderingParameters> local_bc8;
  optional<int> local_b60;
  vector<int,_std::allocator<int>_> local_b58;
  vector<int,_std::allocator<int>_> local_b40;
  pair<std::vector<eos::core::Mesh,_std::allocator<eos::core::Mesh>_>,_std::vector<eos::fitting::RenderingParameters,_std::allocator<eos::fitting::RenderingParameters>_>_>
  local_b28;
  undefined1 local_af8 [8];
  vector<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>_>
  fitted_image_points;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  blendshape_coefficients;
  vector<float,_std::allocator<float>_> pca_shape_coefficients;
  Mat *image;
  iterator __end1_2;
  iterator __begin1_2;
  vector<cv::Mat,_std::allocator<cv::Mat>_> *__range1_2;
  vector<int,_std::allocator<int>_> image_heights;
  vector<int,_std::allocator<int>_> image_widths;
  vector<eos::fitting::RenderingParameters,_std::allocator<eos::fitting::RenderingParameters>_>
  per_frame_rendering_params;
  vector<eos::core::Mesh,_std::allocator<eos::core::Mesh>_> per_frame_meshes;
  undefined1 local_a10 [8];
  EdgeTopology edge_topology;
  undefined1 local_9c0 [8];
  ContourLandmarks ibug_contour;
  string local_988;
  undefined1 local_968 [8];
  ModelContour model_contour;
  undefined1 local_918 [8];
  vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>
  blendshapes;
  string local_8f8;
  undefined1 local_8d8 [8];
  LandmarkMapper landmark_mapper;
  runtime_error *e_2;
  MorphableModel local_878;
  undefined1 local_6c0 [8];
  MorphableModel morphable_model;
  runtime_error *e_1;
  LandmarkCollection<Eigen::Vector2f> local_4e0;
  reference local_4c8;
  path *landmarksfile;
  iterator __end1_1;
  iterator __begin1_1;
  vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_> *__range1_1;
  vector<std::vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>,_std::allocator<std::vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>_>_>
  per_frame_landmarks;
  path *imagefile;
  iterator __end1;
  iterator __begin1;
  vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_> *__range1;
  vector<cv::Mat,_std::allocator<cv::Mat>_> images;
  error *e;
  key_type local_3e8;
  basic_command_line_parser<char> local_3c8;
  basic_parsed_options<char> local_350;
  variables_map local_328 [8];
  variables_map vm;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_318 [144];
  path local_288;
  path local_268;
  path local_248;
  path local_228;
  path local_208;
  path local_1e8;
  undefined8 local_1c8 [3];
  allocator<char> local_1a9;
  string local_1a8 [32];
  options_description local_188 [8];
  options_description desc;
  undefined1 local_108 [8];
  vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_> landmarksfiles;
  vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_> imagefiles;
  path outputfilebase;
  path blendshapesfile;
  path edgetopologyfile;
  path contourfile;
  path mappingsfile;
  path modelfile;
  char **argv_local;
  int argc_local;
  
  boost::filesystem::path::path((path *)((long)&mappingsfile.m_pathname.field_2 + 8));
  boost::filesystem::path::path((path *)((long)&contourfile.m_pathname.field_2 + 8));
  boost::filesystem::path::path((path *)((long)&edgetopologyfile.m_pathname.field_2 + 8));
  boost::filesystem::path::path((path *)((long)&blendshapesfile.m_pathname.field_2 + 8));
  boost::filesystem::path::path((path *)((long)&outputfilebase.m_pathname.field_2 + 8));
  boost::filesystem::path::path
            ((path *)&imagefiles.
                      super__Vector_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>::vector
            ((vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_> *)
             &landmarksfiles.
              super__Vector_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>::vector
            ((vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_> *)local_108)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1a8,"Allowed options",&local_1a9);
  boost::program_options::options_description::options_description
            (local_188,local_1a8,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  std::__cxx11::string::~string(local_1a8);
  std::allocator<char>::~allocator(&local_1a9);
  local_1c8[0] = boost::program_options::options_description::add_options();
  pcVar4 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)local_1c8,"help,h");
  ptVar5 = boost::program_options::value<boost::filesystem::path>
                     ((path *)((long)&mappingsfile.m_pathname.field_2 + 8));
  ptVar5 = boost::program_options::typed_value<boost::filesystem::path,_char>::required(ptVar5);
  boost::filesystem::path::path(&local_1e8,"../share/sfm_shape_3448.bin");
  ptVar5 = boost::program_options::typed_value<boost::filesystem::path,_char>::default_value
                     (ptVar5,&local_1e8);
  pcVar4 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar4,(value_semantic *)"model,m",(char *)ptVar5);
  ptVar6 = boost::program_options::
           value<std::vector<boost::filesystem::path,std::allocator<boost::filesystem::path>>>
                     ((vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_> *)
                      &landmarksfiles.
                       super__Vector_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ptVar6 = boost::program_options::
           typed_value<std::vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>,_char>
           ::multitoken(ptVar6);
  pcVar4 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar4,(value_semantic *)"image,i",(char *)ptVar6);
  ptVar6 = boost::program_options::
           value<std::vector<boost::filesystem::path,std::allocator<boost::filesystem::path>>>
                     ((vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_> *)
                      local_108);
  ptVar6 = boost::program_options::
           typed_value<std::vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>,_char>
           ::multitoken(ptVar6);
  pcVar4 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar4,(value_semantic *)"landmarks,l",(char *)ptVar6);
  ptVar5 = boost::program_options::value<boost::filesystem::path>
                     ((path *)((long)&contourfile.m_pathname.field_2 + 8));
  ptVar5 = boost::program_options::typed_value<boost::filesystem::path,_char>::required(ptVar5);
  boost::filesystem::path::path(&local_208,"../share/ibug_to_sfm.txt");
  ptVar5 = boost::program_options::typed_value<boost::filesystem::path,_char>::default_value
                     (ptVar5,&local_208);
  pcVar4 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar4,(value_semantic *)"mapping,p",(char *)ptVar5);
  ptVar5 = boost::program_options::value<boost::filesystem::path>
                     ((path *)((long)&edgetopologyfile.m_pathname.field_2 + 8));
  ptVar5 = boost::program_options::typed_value<boost::filesystem::path,_char>::required(ptVar5);
  boost::filesystem::path::path(&local_228,"../share/model_contours.json");
  ptVar5 = boost::program_options::typed_value<boost::filesystem::path,_char>::default_value
                     (ptVar5,&local_228);
  pcVar4 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar4,(value_semantic *)"model-contour,c",(char *)ptVar5);
  ptVar5 = boost::program_options::value<boost::filesystem::path>
                     ((path *)((long)&blendshapesfile.m_pathname.field_2 + 8));
  ptVar5 = boost::program_options::typed_value<boost::filesystem::path,_char>::required(ptVar5);
  boost::filesystem::path::path(&local_248,"../share/sfm_3448_edge_topology.json");
  ptVar5 = boost::program_options::typed_value<boost::filesystem::path,_char>::default_value
                     (ptVar5,&local_248);
  pcVar4 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar4,(value_semantic *)"edge-topology,e",(char *)ptVar5);
  ptVar5 = boost::program_options::value<boost::filesystem::path>
                     ((path *)((long)&outputfilebase.m_pathname.field_2 + 8));
  ptVar5 = boost::program_options::typed_value<boost::filesystem::path,_char>::required(ptVar5);
  boost::filesystem::path::path(&local_268,"../share/expression_blendshapes_3448.bin");
  ptVar5 = boost::program_options::typed_value<boost::filesystem::path,_char>::default_value
                     (ptVar5,&local_268);
  pcVar4 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar4,(value_semantic *)"blendshapes,b",(char *)ptVar5);
  ptVar5 = boost::program_options::value<boost::filesystem::path>
                     ((path *)&imagefiles.
                               super__Vector_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ptVar5 = boost::program_options::typed_value<boost::filesystem::path,_char>::required(ptVar5);
  boost::filesystem::path::path(&local_288,"out");
  ptVar5 = boost::program_options::typed_value<boost::filesystem::path,_char>::default_value
                     (ptVar5,&local_288);
  boost::program_options::options_description_easy_init::operator()
            (pcVar4,(value_semantic *)"output,o",(char *)ptVar5);
  boost::filesystem::path::~path(&local_288);
  boost::filesystem::path::~path(&local_268);
  boost::filesystem::path::~path(&local_248);
  boost::filesystem::path::~path(&local_228);
  boost::filesystem::path::~path(&local_208);
  boost::filesystem::path::~path(&local_1e8);
  boost::program_options::variables_map::variables_map(local_328);
  boost::program_options::basic_command_line_parser<char>::basic_command_line_parser
            (&local_3c8,argc,argv);
  this_02 = boost::program_options::basic_command_line_parser<char>::options(&local_3c8,local_188);
  boost::program_options::basic_command_line_parser<char>::run(&local_350,this_02);
  boost::program_options::store((basic_parsed_options *)&local_350,local_328,false);
  boost::program_options::basic_parsed_options<char>::~basic_parsed_options(&local_350);
  boost::program_options::basic_command_line_parser<char>::~basic_command_line_parser(&local_3c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3e8,"help",(allocator<char> *)((long)&e + 7));
  sVar7 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count(local_318,&local_3e8);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&e + 7));
  if (sVar7 == 0) {
    boost::program_options::notify(local_328);
  }
  else {
    poVar8 = std::operator<<((ostream *)&std::cout,"Usage: fit-model-multi [options]");
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    boost::program_options::operator<<((ostream *)&std::cout,local_188);
  }
  argv_local._4_4_ = 0;
  e._0_4_ = (uint)(sVar7 != 0);
  boost::program_options::variables_map::~variables_map(local_328);
  boost::program_options::options_description::~options_description(local_188);
  if ((uint)e == 0) {
    sVar9 = std::vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>::size
                      ((vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_> *)
                       local_108);
    sVar10 = std::vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>::size
                       ((vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_> *
                        )&landmarksfiles.
                          super__Vector_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (sVar9 == sVar10) {
      bVar3 = std::vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>::empty
                        ((vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>
                          *)local_108);
      if (bVar3) {
        poVar8 = std::operator<<((ostream *)&std::cout,
                                 "Please give at least 1 image and landmark file.");
        std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
        argv_local._4_4_ = 1;
        e._0_4_ = 1;
      }
      else {
        std::vector<cv::Mat,_std::allocator<cv::Mat>_>::vector
                  ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)&__range1);
        this = &landmarksfiles.
                super__Vector_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
        __end1 = std::vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>::
                 begin((vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_> *)
                       this);
        imagefile = (path *)std::
                            vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>
                            ::end((vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>
                                   *)this);
        while (bVar3 = __gnu_cxx::operator!=
                                 (&__end1,(__normal_iterator<boost::filesystem::path_*,_std::vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>_>
                                           *)&imagefile), bVar3) {
          this_04 = __gnu_cxx::
                    __normal_iterator<boost::filesystem::path_*,_std::vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>_>
                    ::operator*(&__end1);
          psVar11 = boost::filesystem::path::string_abi_cxx11_(this_04);
          cv::imread((string *)
                     &per_frame_landmarks.
                      super__Vector_base<std::vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>,_std::allocator<std::vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,(int)psVar11);
          std::vector<cv::Mat,_std::allocator<cv::Mat>_>::push_back
                    ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)&__range1,
                     (value_type *)
                     &per_frame_landmarks.
                      super__Vector_base<std::vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>,_std::allocator<std::vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          cv::Mat::~Mat((Mat *)&per_frame_landmarks.
                                super__Vector_base<std::vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>,_std::allocator<std::vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
          __gnu_cxx::
          __normal_iterator<boost::filesystem::path_*,_std::vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>_>
          ::operator++(&__end1);
        }
        std::
        vector<std::vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>,_std::allocator<std::vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>_>_>
        ::vector((vector<std::vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>,_std::allocator<std::vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>_>_>
                  *)&__range1_1);
        __end1_1 = std::vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>::
                   begin((vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>
                          *)local_108);
        landmarksfile =
             (path *)std::vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>
                     ::end((vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>
                            *)local_108);
        while (bVar3 = __gnu_cxx::operator!=
                                 (&__end1_1,
                                  (__normal_iterator<boost::filesystem::path_*,_std::vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>_>
                                   *)&landmarksfile), bVar3) {
          local_4c8 = __gnu_cxx::
                      __normal_iterator<boost::filesystem::path_*,_std::vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>_>
                      ::operator*(&__end1_1);
          psVar11 = boost::filesystem::path::string_abi_cxx11_(local_4c8);
          std::__cxx11::string::string((string *)&e_1,(string *)psVar11);
          eos::core::read_pts_landmarks(&local_4e0,(string *)&e_1);
          std::
          vector<std::vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>,_std::allocator<std::vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>_>_>
          ::push_back((vector<std::vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>,_std::allocator<std::vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>_>_>
                       *)&__range1_1,&local_4e0);
          std::
          vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
          ::~vector(&local_4e0);
          std::__cxx11::string::~string((string *)&e_1);
          __gnu_cxx::
          __normal_iterator<boost::filesystem::path_*,_std::vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>_>
          ::operator++(&__end1_1);
        }
        eos::morphablemodel::MorphableModel::MorphableModel((MorphableModel *)local_6c0);
        psVar11 = boost::filesystem::path::string_abi_cxx11_
                            ((path *)((long)&mappingsfile.m_pathname.field_2 + 8));
        std::__cxx11::string::string((string *)&e_2,(string *)psVar11);
        eos::morphablemodel::load_model(&local_878,(string *)&e_2);
        eos::morphablemodel::MorphableModel::operator=((MorphableModel *)local_6c0,&local_878);
        eos::morphablemodel::MorphableModel::~MorphableModel(&local_878);
        std::__cxx11::string::~string((string *)&e_2);
        bVar3 = boost::filesystem::path::empty((path *)((long)&contourfile.m_pathname.field_2 + 8));
        blendshapes.
        super__Vector_base<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
        if (bVar3) {
          memset(local_8d8,0,0x38);
          eos::core::LandmarkMapper::LandmarkMapper((LandmarkMapper *)local_8d8);
        }
        else {
          psVar11 = boost::filesystem::path::string_abi_cxx11_
                              ((path *)((long)&contourfile.m_pathname.field_2 + 8));
          std::__cxx11::string::string((string *)&local_8f8,(string *)psVar11);
          blendshapes.
          super__Vector_base<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
          eos::core::LandmarkMapper::LandmarkMapper((LandmarkMapper *)local_8d8,&local_8f8);
        }
        if ((blendshapes.
             super__Vector_base<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_8f8);
        }
        psVar11 = boost::filesystem::path::string_abi_cxx11_
                            ((path *)((long)&outputfilebase.m_pathname.field_2 + 8));
        std::__cxx11::string::string
                  ((string *)
                   &model_contour.left_contour.super__Vector_base<int,_std::allocator<int>_>._M_impl
                    .super__Vector_impl_data._M_end_of_storage,(string *)psVar11);
        eos::morphablemodel::load_blendshapes
                  ((vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>
                    *)local_918,
                   (string *)
                   &model_contour.left_contour.super__Vector_base<int,_std::allocator<int>_>._M_impl
                    .super__Vector_impl_data._M_end_of_storage);
        std::__cxx11::string::~string
                  ((string *)
                   &model_contour.left_contour.super__Vector_base<int,_std::allocator<int>_>._M_impl
                    .super__Vector_impl_data._M_end_of_storage);
        bVar3 = boost::filesystem::path::empty
                          ((path *)((long)&edgetopologyfile.m_pathname.field_2 + 8));
        ibug_contour.left_contour.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
        if (bVar3) {
          memset(local_968,0,0x30);
          eos::fitting::ModelContour::ModelContour((ModelContour *)local_968);
        }
        else {
          psVar11 = boost::filesystem::path::string_abi_cxx11_
                              ((path *)((long)&edgetopologyfile.m_pathname.field_2 + 8));
          std::__cxx11::string::string((string *)&local_988,(string *)psVar11);
          ibug_contour.left_contour.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
          eos::fitting::ModelContour::load((ModelContour *)local_968,&local_988);
        }
        if ((ibug_contour.left_contour.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_988);
        }
        psVar11 = boost::filesystem::path::string_abi_cxx11_
                            ((path *)((long)&contourfile.m_pathname.field_2 + 8));
        std::__cxx11::string::string
                  ((string *)
                   &edge_topology.adjacent_vertices.
                    super__Vector_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)psVar11);
        eos::fitting::ContourLandmarks::load
                  ((ContourLandmarks *)local_9c0,
                   (string *)
                   &edge_topology.adjacent_vertices.
                    super__Vector_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::__cxx11::string::~string
                  ((string *)
                   &edge_topology.adjacent_vertices.
                    super__Vector_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        psVar11 = boost::filesystem::path::string_abi_cxx11_
                            ((path *)((long)&blendshapesfile.m_pathname.field_2 + 8));
        std::__cxx11::string::string
                  ((string *)
                   &per_frame_meshes.
                    super__Vector_base<eos::core::Mesh,_std::allocator<eos::core::Mesh>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,(string *)psVar11);
        eos::morphablemodel::load_edge_topology
                  ((EdgeTopology *)local_a10,
                   (string *)
                   &per_frame_meshes.
                    super__Vector_base<eos::core::Mesh,_std::allocator<eos::core::Mesh>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        std::__cxx11::string::~string
                  ((string *)
                   &per_frame_meshes.
                    super__Vector_base<eos::core::Mesh,_std::allocator<eos::core::Mesh>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        std::vector<eos::core::Mesh,_std::allocator<eos::core::Mesh>_>::vector
                  ((vector<eos::core::Mesh,_std::allocator<eos::core::Mesh>_> *)
                   &per_frame_rendering_params.
                    super__Vector_base<eos::fitting::RenderingParameters,_std::allocator<eos::fitting::RenderingParameters>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::
        vector<eos::fitting::RenderingParameters,_std::allocator<eos::fitting::RenderingParameters>_>
        ::vector((vector<eos::fitting::RenderingParameters,_std::allocator<eos::fitting::RenderingParameters>_>
                  *)&image_widths.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)
                   &image_heights.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)&__range1_2);
        __end1_2 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::begin
                             ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)&__range1);
        image = (Mat *)std::vector<cv::Mat,_std::allocator<cv::Mat>_>::end
                                 ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)&__range1);
        while (bVar3 = __gnu_cxx::operator!=
                                 (&__end1_2,
                                  (__normal_iterator<cv::Mat_*,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>
                                   *)&image), bVar3) {
          pMVar12 = __gnu_cxx::
                    __normal_iterator<cv::Mat_*,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>::
                    operator*(&__end1_2);
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)
                     &image_heights.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,(value_type *)(pMVar12 + 0xc));
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)&__range1_2,(value_type *)(pMVar12 + 8));
          __gnu_cxx::__normal_iterator<cv::Mat_*,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>::
          operator++(&__end1_2);
        }
        std::vector<float,_std::allocator<float>_>::vector
                  ((vector<float,_std::allocator<float>_> *)
                   &blendshape_coefficients.
                    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::
        vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
        ::vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                  *)&fitted_image_points.
                     super__Vector_base<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::
        vector<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>_>
        ::vector((vector<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>_>
                  *)local_af8);
        std::vector<int,_std::allocator<int>_>::vector
                  (&local_b40,
                   (vector<int,_std::allocator<int>_> *)
                   &image_heights.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        std::vector<int,_std::allocator<int>_>::vector
                  (&local_b58,(vector<int,_std::allocator<int>_> *)&__range1_2);
        std::optional<int>::optional(&local_b60);
        std::optional<eos::fitting::RenderingParameters>::optional();
        eos::fitting::fit_shape_and_pose
                  (&local_b28,(MorphableModel *)local_6c0,
                   (vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>
                    *)local_918,
                   (vector<std::vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>,_std::allocator<std::vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>_>_>
                    *)&__range1_1,(LandmarkMapper *)local_8d8,&local_b40,&local_b58,
                   (EdgeTopology *)local_a10,(ContourLandmarks *)local_9c0,(ModelContour *)local_968
                   ,5,local_b60,30.0,&local_bc8,
                   (vector<float,_std::allocator<float>_> *)
                   &blendshape_coefficients.
                    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                    *)&fitted_image_points.
                       super__Vector_base<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (vector<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>_>
                    *)local_af8);
        std::
        tie<std::vector<eos::core::Mesh,std::allocator<eos::core::Mesh>>,std::vector<eos::fitting::RenderingParameters,std::allocator<eos::fitting::RenderingParameters>>>
                  ((vector<eos::core::Mesh,_std::allocator<eos::core::Mesh>_> *)&__range1_3,
                   (vector<eos::fitting::RenderingParameters,_std::allocator<eos::fitting::RenderingParameters>_>
                    *)&per_frame_rendering_params.
                       super__Vector_base<eos::fitting::RenderingParameters,_std::allocator<eos::fitting::RenderingParameters>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::
        tuple<std::vector<eos::core::Mesh,std::allocator<eos::core::Mesh>>&,std::vector<eos::fitting::RenderingParameters,std::allocator<eos::fitting::RenderingParameters>>&>
        ::operator=((tuple<std::vector<eos::core::Mesh,std::allocator<eos::core::Mesh>>&,std::vector<eos::fitting::RenderingParameters,std::allocator<eos::fitting::RenderingParameters>>&>
                     *)&__range1_3,&local_b28);
        std::
        pair<std::vector<eos::core::Mesh,_std::allocator<eos::core::Mesh>_>,_std::vector<eos::fitting::RenderingParameters,_std::allocator<eos::fitting::RenderingParameters>_>_>
        ::~pair(&local_b28);
        std::vector<int,_std::allocator<int>_>::~vector(&local_b58);
        std::vector<int,_std::allocator<int>_>::~vector(&local_b40);
        std::operator<<((ostream *)&std::cout,"Final pca shape coefficients: ");
        this_00 = &blendshape_coefficients.
                   super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        __end1_3 = std::vector<float,_std::allocator<float>_>::begin
                             ((vector<float,_std::allocator<float>_> *)this_00);
        iStack_bf8 = std::vector<float,_std::allocator<float>_>::end
                               ((vector<float,_std::allocator<float>_> *)this_00);
        while (bVar3 = __gnu_cxx::operator!=(&__end1_3,&stack0xfffffffffffff408), bVar3) {
          pfVar13 = __gnu_cxx::
                    __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
                    operator*(&__end1_3);
          texturemap_averaging._196_4_ = *pfVar13;
          poVar8 = (ostream *)
                   std::ostream::operator<<(&std::cout,(float)texturemap_averaging._196_4_);
          std::operator<<(poVar8,' ');
          __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
          operator++(&__end1_3);
        }
        std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
        WeightedIsomapAveraging::WeightedIsomapAveraging((WeightedIsomapAveraging *)local_cc8,60.0);
        cv::Mat::Mat((Mat *)&yaw_angle);
        for (local_d2c = 0;
            sVar9 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::size
                              ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)&__range1),
            local_d2c < sVar9; local_d2c = local_d2c + 1) {
          std::
          vector<eos::fitting::RenderingParameters,_std::allocator<eos::fitting::RenderingParameters>_>
          ::operator[]((vector<eos::fitting::RenderingParameters,_std::allocator<eos::fitting::RenderingParameters>_>
                        *)&image_widths.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,(ulong)local_d2c);
          eos::fitting::RenderingParameters::get_yaw_pitch_roll
                    ((RenderingParameters *)
                     ((long)&texturemap.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
          Eigen::DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>::operator[]
                    ((DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1> *)
                     ((long)&texturemap.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 4),0);
          pvVar14 = std::vector<eos::core::Mesh,_std::allocator<eos::core::Mesh>_>::operator[]
                              ((vector<eos::core::Mesh,_std::allocator<eos::core::Mesh>_> *)
                               &per_frame_rendering_params.
                                super__Vector_base<eos::fitting::RenderingParameters,_std::allocator<eos::fitting::RenderingParameters>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_d2c)
          ;
          pvVar15 = std::
                    vector<eos::fitting::RenderingParameters,_std::allocator<eos::fitting::RenderingParameters>_>
                    ::operator[]((vector<eos::fitting::RenderingParameters,_std::allocator<eos::fitting::RenderingParameters>_>
                                  *)&image_widths.super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage,
                                 (ulong)local_d2c);
          eos::fitting::RenderingParameters::get_modelview(&local_da8,pvVar15);
          pvVar15 = std::
                    vector<eos::fitting::RenderingParameters,_std::allocator<eos::fitting::RenderingParameters>_>
                    ::operator[]((vector<eos::fitting::RenderingParameters,_std::allocator<eos::fitting::RenderingParameters>_>
                                  *)&image_widths.super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage,
                                 (ulong)local_d2c);
          eos::fitting::RenderingParameters::get_projection(&local_de8,pvVar15);
          pvVar16 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::operator[]
                              ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)&__range1,
                               (ulong)local_d2c);
          eos::core::from_mat_with_alpha(&local_e10,pvVar16);
          eos::render::extract_texture
                    ((Image4u *)local_d68,pvVar14,&local_da8,&local_de8,Orthographic,&local_e10,
                     0x200);
          eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>::~Image(&local_e10);
          std::vector<cv::Mat,_std::allocator<cv::Mat>_>::operator[]
                    ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)&__range1,(ulong)local_d2c);
          cv::Mat::clone();
          this_05 = std::
                    vector<std::vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>,_std::allocator<std::vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>_>_>
                    ::operator[]((vector<std::vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>,_std::allocator<std::vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>_>_>
                                  *)&__range1_1,(ulong)local_d2c);
          __end2 = std::
                   vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
                   ::begin(this_05);
          lm = (Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_> *)
               std::
               vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
               ::end(this_05);
          while (bVar3 = __gnu_cxx::operator!=
                                   (&__end2,(__normal_iterator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_*,_std::vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>_>
                                             *)&lm), bVar3) {
            local_e90 = __gnu_cxx::
                        __normal_iterator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_*,_std::vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>_>
                        ::operator*(&__end2);
            cv::_InputOutputArray::_InputOutputArray(&local_ea8,(Mat *)&__range2);
            pfVar17 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0>::operator[]
                                ((DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0> *)
                                 &local_e90->coordinates,0);
            fVar2 = *pfVar17;
            pfVar17 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0>::operator[]
                                ((DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0> *)
                                 &local_e90->coordinates,1);
            cv::Point_<float>::Point_(&local_eb8,fVar2 + -2.0,*pfVar17 + -2.0);
            cv::Point_::operator_cast_to_Point_(local_eb0);
            pfVar17 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0>::operator[]
                                ((DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0> *)
                                 &local_e90->coordinates,0);
            fVar2 = *pfVar17;
            pfVar17 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0>::operator[]
                                ((DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0> *)
                                 &local_e90->coordinates,1);
            cv::Point_<float>::Point_(&local_ec8,fVar2 + 2.0,*pfVar17 + 2.0);
            cv::Point_::operator_cast_to_Point_(local_ec0);
            cv::Scalar_<double>::Scalar_(&local_ee8,255.0,0.0,0.0,0.0);
            cv::rectangle(&local_ea8,local_eb0,local_ec0,&local_ee8,1,8);
            cv::_InputOutputArray::~_InputOutputArray(&local_ea8);
            __gnu_cxx::
            __normal_iterator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_*,_std::vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>_>
            ::operator++(&__end2);
          }
          cv::Mat::Mat(local_f48,(Mat *)&__range2);
          pvVar14 = std::vector<eos::core::Mesh,_std::allocator<eos::core::Mesh>_>::operator[]
                              ((vector<eos::core::Mesh,_std::allocator<eos::core::Mesh>_> *)
                               &per_frame_rendering_params.
                                super__Vector_base<eos::fitting::RenderingParameters,_std::allocator<eos::fitting::RenderingParameters>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_d2c)
          ;
          pvVar15 = std::
                    vector<eos::fitting::RenderingParameters,_std::allocator<eos::fitting::RenderingParameters>_>
                    ::operator[]((vector<eos::fitting::RenderingParameters,_std::allocator<eos::fitting::RenderingParameters>_>
                                  *)&image_widths.super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage,
                                 (ulong)local_d2c);
          eos::fitting::RenderingParameters::get_modelview(&local_f88,pvVar15);
          pvVar15 = std::
                    vector<eos::fitting::RenderingParameters,_std::allocator<eos::fitting::RenderingParameters>_>
                    ::operator[]((vector<eos::fitting::RenderingParameters,_std::allocator<eos::fitting::RenderingParameters>_>
                                  *)&image_widths.super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage,
                                 (ulong)local_d2c);
          eos::fitting::RenderingParameters::get_projection(&local_fc8,pvVar15);
          pvVar16 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::operator[]
                              ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)&__range1,
                               (ulong)local_d2c);
          width = *(int *)(pvVar16 + 0xc);
          pvVar16 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::operator[]
                              ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)&__range1,
                               (ulong)local_d2c);
          eos::fitting::get_opencv_viewport((fitting *)&local_fd8,width,*(int *)(pvVar16 + 8));
          cv::Scalar_<double>::Scalar_
                    ((Scalar_<double> *)((long)&outputfile_1.m_pathname.field_2 + 8),0.0,255.0,0.0,
                     255.0);
          eos::render::draw_wireframe
                    (local_f48,pvVar14,&local_f88,&local_fc8,&local_fd8,
                     (Scalar *)((long)&outputfile_1.m_pathname.field_2 + 8));
          cv::Mat::~Mat(local_f48);
          boost::filesystem::path::path
                    ((path *)local_1018,
                     (path *)&imagefiles.
                              super__Vector_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>::operator[]
                    ((vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_> *)
                     &landmarksfiles.
                      super__Vector_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_d2c);
          boost::filesystem::path::stem();
          boost::filesystem::path::operator+=((path *)local_1018,&local_1038);
          boost::filesystem::path::~path(&local_1038);
          boost::filesystem::path::path(&local_1058,".png");
          boost::filesystem::path::operator+=((path *)local_1018,&local_1058);
          boost::filesystem::path::~path(&local_1058);
          psVar11 = boost::filesystem::path::string_abi_cxx11_((path *)local_1018);
          cv::_InputArray::_InputArray(&local_1070,(Mat *)&__range2);
          modelview_frontal_1.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
          m_data.array[0xe] = 0.0;
          modelview_frontal_1.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
          m_data.array[0xf] = 0.0;
          this_01 = (vector *)
                    (modelview_frontal_1.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>
                     .m_storage.m_data.array + 0xe);
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)this_01);
          cv::imwrite((string *)psVar11,&local_1070,this_01);
          std::vector<int,_std::allocator<int>_>::~vector
                    ((vector<int,_std::allocator<int>_> *)
                     (modelview_frontal_1.
                      super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                      array + 0xe));
          cv::_InputArray::~_InputArray(&local_1070);
          Eigen::MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::Identity();
          Eigen::Matrix<float,4,4,0,4,4>::
          Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,Eigen::Matrix<float,4,4,0,4,4>>>
                    ((Matrix<float,4,4,0,4,4> *)local_10c8,
                     (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                      *)((long)&neutral_expression_1.tti.
                                super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage + 5));
          pPVar18 = eos::morphablemodel::MorphableModel::get_shape_model
                              ((MorphableModel *)local_6c0);
          std::vector<float,_std::allocator<float>_>::vector
                    (&local_1188,
                     (vector<float,_std::allocator<float>_> *)
                     &blendshape_coefficients.
                      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          eos::morphablemodel::PcaModel::draw_sample
                    ((PcaModel *)local_1170,(vector<float,_std::allocator<float>_> *)pPVar18);
          pPVar18 = eos::morphablemodel::MorphableModel::get_color_model
                              ((MorphableModel *)local_6c0);
          pVVar19 = eos::morphablemodel::PcaModel::get_mean(pPVar18);
          pPVar18 = eos::morphablemodel::MorphableModel::get_shape_model
                              ((MorphableModel *)local_6c0);
          pvVar20 = eos::morphablemodel::PcaModel::get_triangle_list(pPVar18);
          pPVar18 = eos::morphablemodel::MorphableModel::get_color_model
                              ((MorphableModel *)local_6c0);
          pvVar21 = eos::morphablemodel::PcaModel::get_triangle_list(pPVar18);
          pvVar22 = eos::morphablemodel::MorphableModel::get_texture_coordinates
                              ((MorphableModel *)local_6c0);
          frontal_rendering_1.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          ppuVar1 = &frontal_rendering_1.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
          std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::vector
                    ((vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)ppuVar1
                    );
          eos::morphablemodel::sample_to_mesh
                    ((Mesh *)(local_1170 + 0x10),(VectorXf *)local_1170,pVVar19,pvVar20,pvVar21,
                     pvVar22,(vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *
                             )ppuVar1);
          std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::~vector
                    ((vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)
                     &frontal_rendering_1.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
          Eigen::Matrix<float,_-1,_1,_0,_-1,_1>::~Matrix
                    ((Matrix<float,__1,_1,_0,__1,_1> *)local_1170);
          std::vector<float,_std::allocator<float>_>::~vector(&local_1188);
          eos::render::ortho<float>(&local_1218,-130.0,130.0,-130.0,130.0);
          eos::render::create_mipmapped_texture(&local_1238,(Image4u *)local_d68,0);
          eos::render::render((Image4u *)local_11d0,(Mesh *)(local_1170 + 0x10),
                              (Matrix4f *)local_10c8,&local_1218,0x100,0x100,&local_1238,true,false,
                              false);
          eos::render::Texture::~Texture(&local_1238);
          boost::filesystem::path::path(&local_1258,".frontal.png");
          boost::filesystem::path::replace_extension((path *)local_1018);
          boost::filesystem::path::~path(&local_1258);
          psVar11 = boost::filesystem::path::string_abi_cxx11_((path *)local_1018);
          eos::core::to_mat(local_12d0,(Image4u *)local_11d0);
          cv::_InputArray::_InputArray(&local_1270,(Mat *)local_12d0);
          local_12e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          local_12e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          local_12e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          std::vector<int,_std::allocator<int>_>::vector(&local_12e8);
          cv::imwrite((string *)psVar11,&local_1270,(vector *)&local_12e8);
          std::vector<int,_std::allocator<int>_>::~vector(&local_12e8);
          cv::_InputArray::~_InputArray(&local_1270);
          cv::Mat::~Mat((Mat *)local_12d0);
          boost::filesystem::path::path(&local_1308,"");
          boost::filesystem::path::replace_extension((path *)local_1018);
          boost::filesystem::path::~path(&local_1308);
          eos::core::to_mat(local_1368,(Image4u *)local_d68);
          boost::filesystem::path::path(&local_1388,".texture.png");
          boost::filesystem::path::replace_extension((path *)local_1018);
          boost::filesystem::path::~path(&local_1388);
          psVar11 = boost::filesystem::path::string_abi_cxx11_((path *)local_1018);
          cv::_InputArray::_InputArray(&local_13a0,(Mat *)local_1368);
          local_13b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          local_13b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          local_13b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          std::vector<int,_std::allocator<int>_>::vector(&local_13b8);
          cv::imwrite((string *)psVar11,&local_13a0,(vector *)&local_13b8);
          std::vector<int,_std::allocator<int>_>::~vector(&local_13b8);
          cv::_InputArray::~_InputArray(&local_13a0);
          WeightedIsomapAveraging::add_and_merge
                    ((WeightedIsomapAveraging *)((long)&outputfile.m_pathname.field_2 + 8),
                     (Mat *)local_cc8);
          cv::Mat::operator=((Mat *)&yaw_angle,
                             (Mat *)(outputfile.m_pathname.field_2._M_local_buf + 8));
          cv::Mat::~Mat((Mat *)(outputfile.m_pathname.field_2._M_local_buf + 8));
          cv::Mat::~Mat((Mat *)local_1368);
          eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>::~Image
                    ((Image<eos::core::Pixel<unsigned_char,_4>_> *)local_11d0);
          eos::core::Mesh::~Mesh((Mesh *)(local_1170 + 0x10));
          boost::filesystem::path::~path((path *)local_1018);
          cv::Mat::~Mat((Mat *)&__range2);
          eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>::~Image
                    ((Image<eos::core::Pixel<unsigned_char,_4>_> *)local_d68);
        }
        boost::filesystem::path::path
                  ((path *)local_1438,
                   (path *)&imagefiles.
                            super__Vector_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        boost::filesystem::path::path(&local_1458,"merged.texture.png");
        boost::filesystem::path::operator+=((path *)local_1438,&local_1458);
        boost::filesystem::path::~path(&local_1458);
        psVar11 = boost::filesystem::path::string_abi_cxx11_((path *)local_1438);
        cv::_InputArray::_InputArray(&local_1470,(Mat *)&yaw_angle);
        local_1488.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_1488.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        local_1488.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        std::vector<int,_std::allocator<int>_>::vector(&local_1488);
        cv::imwrite((string *)psVar11,&local_1470,(vector *)&local_1488);
        std::vector<int,_std::allocator<int>_>::~vector(&local_1488);
        cv::_InputArray::~_InputArray(&local_1470);
        boost::filesystem::path::path
                  ((path *)(modelview_frontal.
                            super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                            m_data.array + 0xe),"");
        boost::filesystem::path::replace_extension((path *)local_1438);
        boost::filesystem::path::~path
                  ((path *)(modelview_frontal.
                            super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                            m_data.array + 0xe));
        Eigen::MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::Identity();
        Eigen::Matrix<float,4,4,0,4,4>::
        Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,Eigen::Matrix<float,4,4,0,4,4>>>
                  ((Matrix<float,4,4,0,4,4> *)local_14e8,
                   (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                    *)((long)&neutral_expression.tti.
                              super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 5));
        pPVar18 = eos::morphablemodel::MorphableModel::get_shape_model((MorphableModel *)local_6c0);
        std::vector<float,_std::allocator<float>_>::vector
                  (&local_15a8,
                   (vector<float,_std::allocator<float>_> *)
                   &blendshape_coefficients.
                    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        eos::morphablemodel::PcaModel::draw_sample
                  ((PcaModel *)local_1590,(vector<float,_std::allocator<float>_> *)pPVar18);
        pPVar18 = eos::morphablemodel::MorphableModel::get_color_model((MorphableModel *)local_6c0);
        pVVar19 = eos::morphablemodel::PcaModel::get_mean(pPVar18);
        pPVar18 = eos::morphablemodel::MorphableModel::get_shape_model((MorphableModel *)local_6c0);
        pvVar20 = eos::morphablemodel::PcaModel::get_triangle_list(pPVar18);
        pPVar18 = eos::morphablemodel::MorphableModel::get_color_model((MorphableModel *)local_6c0);
        pvVar21 = eos::morphablemodel::PcaModel::get_triangle_list(pPVar18);
        pvVar22 = eos::morphablemodel::MorphableModel::get_texture_coordinates
                            ((MorphableModel *)local_6c0);
        frontal_rendering.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        ppuVar1 = &frontal_rendering.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
        std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::vector
                  ((vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)ppuVar1);
        eos::morphablemodel::sample_to_mesh
                  ((Mesh *)(local_1590 + 0x10),(VectorXf *)local_1590,pVVar19,pvVar20,pvVar21,
                   pvVar22,(vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)
                           ppuVar1);
        std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::~vector
                  ((vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)
                   &frontal_rendering.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        Eigen::Matrix<float,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<float,__1,_1,_0,__1,_1> *)local_1590)
        ;
        std::vector<float,_std::allocator<float>_>::~vector(&local_15a8);
        eos::render::ortho<float>(&local_1638,-130.0,130.0,-130.0,130.0);
        eos::core::from_mat_with_alpha(&local_1680,(Mat *)&yaw_angle);
        eos::render::create_mipmapped_texture(&local_1658,&local_1680,0);
        eos::render::render((Image4u *)local_15f0,(Mesh *)(local_1590 + 0x10),(Matrix4f *)local_14e8
                            ,&local_1638,0x200,0x200,&local_1658,true,false,false);
        eos::render::Texture::~Texture(&local_1658);
        eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>::~Image(&local_1680);
        boost::filesystem::path::path(&local_16a0,".frontal.png");
        boost::filesystem::path::replace_extension((path *)local_1438);
        boost::filesystem::path::~path(&local_16a0);
        psVar11 = boost::filesystem::path::string_abi_cxx11_((path *)local_1438);
        eos::core::to_mat(local_1718,(Image4u *)local_15f0);
        cv::_InputArray::_InputArray(&local_16b8,(Mat *)local_1718);
        local_1738.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_1738.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        local_1738.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        std::vector<int,_std::allocator<int>_>::vector(&local_1738);
        cv::imwrite((string *)psVar11,&local_16b8,(vector *)&local_1738);
        std::vector<int,_std::allocator<int>_>::~vector(&local_1738);
        cv::_InputArray::~_InputArray(&local_16b8);
        cv::Mat::~Mat((Mat *)local_1718);
        boost::filesystem::path::path(&local_1758,"");
        boost::filesystem::path::replace_extension((path *)local_1438);
        boost::filesystem::path::~path(&local_1758);
        boost::filesystem::path::path(&local_1778,".obj");
        boost::filesystem::path::replace_extension((path *)local_1438);
        boost::filesystem::path::~path(&local_1778);
        std::vector<float,_std::allocator<float>_>::vector
                  (&local_1820,
                   (vector<float,_std::allocator<float>_> *)
                   &blendshape_coefficients.
                    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        local_1838.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
        ._M_start = (pointer)0x0;
        local_1838.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
        ._M_finish = (pointer)0x0;
        local_1838.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage = (pointer)0x0;
        std::vector<float,_std::allocator<float>_>::vector(&local_1838);
        eos::morphablemodel::MorphableModel::draw_sample
                  (&local_1808,(MorphableModel *)local_6c0,&local_1820,&local_1838);
        psVar11 = boost::filesystem::path::string_abi_cxx11_((path *)local_1438);
        std::__cxx11::string::string((string *)&local_1858,(string *)psVar11);
        eos::core::write_textured_obj(&local_1808,&local_1858);
        std::__cxx11::string::~string((string *)&local_1858);
        eos::core::Mesh::~Mesh(&local_1808);
        std::vector<float,_std::allocator<float>_>::~vector(&local_1838);
        std::vector<float,_std::allocator<float>_>::~vector(&local_1820);
        poVar8 = std::operator<<((ostream *)&std::cout,
                                 "Finished fitting and wrote result mesh and texture to files with basename "
                                );
        pbVar23 = boost::filesystem::operator<<
                            (poVar8,(path *)&imagefiles.
                                             super__Vector_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
        poVar8 = std::operator<<(pbVar23,".");
        std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
        argv_local._4_4_ = 0;
        e._0_4_ = 1;
        eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>::~Image
                  ((Image<eos::core::Pixel<unsigned_char,_4>_> *)local_15f0);
        eos::core::Mesh::~Mesh((Mesh *)(local_1590 + 0x10));
        boost::filesystem::path::~path((path *)local_1438);
        cv::Mat::~Mat((Mat *)&yaw_angle);
        WeightedIsomapAveraging::~WeightedIsomapAveraging((WeightedIsomapAveraging *)local_cc8);
        std::
        vector<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>_>
        ::~vector((vector<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>_>
                   *)local_af8);
        std::
        vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
        ::~vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   *)&fitted_image_points.
                      super__Vector_base<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::vector<float,_std::allocator<float>_>::~vector
                  ((vector<float,_std::allocator<float>_> *)
                   &blendshape_coefficients.
                    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)&__range1_2);
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)
                   &image_heights.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        std::
        vector<eos::fitting::RenderingParameters,_std::allocator<eos::fitting::RenderingParameters>_>
        ::~vector((vector<eos::fitting::RenderingParameters,_std::allocator<eos::fitting::RenderingParameters>_>
                   *)&image_widths.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
        std::vector<eos::core::Mesh,_std::allocator<eos::core::Mesh>_>::~vector
                  ((vector<eos::core::Mesh,_std::allocator<eos::core::Mesh>_> *)
                   &per_frame_rendering_params.
                    super__Vector_base<eos::fitting::RenderingParameters,_std::allocator<eos::fitting::RenderingParameters>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        eos::morphablemodel::EdgeTopology::~EdgeTopology((EdgeTopology *)local_a10);
        eos::fitting::ContourLandmarks::~ContourLandmarks((ContourLandmarks *)local_9c0);
        eos::fitting::ModelContour::~ModelContour((ModelContour *)local_968);
        std::
        vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>::
        ~vector((vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>
                 *)local_918);
        eos::core::LandmarkMapper::~LandmarkMapper((LandmarkMapper *)local_8d8);
        eos::morphablemodel::MorphableModel::~MorphableModel((MorphableModel *)local_6c0);
        std::
        vector<std::vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>,_std::allocator<std::vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>_>_>
        ::~vector((vector<std::vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>,_std::allocator<std::vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>_>_>
                   *)&__range1_1);
        std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector
                  ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)&__range1);
      }
    }
    else {
      poVar8 = std::operator<<((ostream *)&std::cout,
                               "Number of landmarks files not equal to number of images given: ");
      sVar9 = std::vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>::size
                        ((vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>
                          *)local_108);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,sVar9);
      poVar8 = std::operator<<(poVar8,"!=");
      sVar9 = std::vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>::size
                        ((vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>
                          *)&landmarksfiles.
                             super__Vector_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
      this_03 = (void *)std::ostream::operator<<(poVar8,sVar9);
      std::ostream::operator<<(this_03,std::endl<char,std::char_traits<char>>);
      argv_local._4_4_ = 1;
      e._0_4_ = 1;
    }
  }
  std::vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>::~vector
            ((vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_> *)local_108)
  ;
  std::vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>::~vector
            ((vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_> *)
             &landmarksfiles.
              super__Vector_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  boost::filesystem::path::~path
            ((path *)&imagefiles.
                      super__Vector_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  boost::filesystem::path::~path((path *)((long)&outputfilebase.m_pathname.field_2 + 8));
  boost::filesystem::path::~path((path *)((long)&blendshapesfile.m_pathname.field_2 + 8));
  boost::filesystem::path::~path((path *)((long)&edgetopologyfile.m_pathname.field_2 + 8));
  boost::filesystem::path::~path((path *)((long)&contourfile.m_pathname.field_2 + 8));
  boost::filesystem::path::~path((path *)((long)&mappingsfile.m_pathname.field_2 + 8));
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char *argv[])
{
    // Note: Could make these all std::string, see fit-model.cpp.
    fs::path modelfile, mappingsfile, contourfile, edgetopologyfile, blendshapesfile, outputfilebase;
    vector<fs::path> imagefiles, landmarksfiles;
    try
    {
        po::options_description desc("Allowed options");
        // clang-format off
        desc.add_options()
            ("help,h", "display the help message")
            ("model,m", po::value<fs::path>(&modelfile)->required()->default_value("../share/sfm_shape_3448.bin"),
                "a Morphable Model stored as cereal BinaryArchive")
            ("image,i", po::value<vector<fs::path>>(&imagefiles)->multitoken(),
                "an input image")
            ("landmarks,l", po::value<vector<fs::path>>(&landmarksfiles)->multitoken(),
                "2D landmarks for the image, in ibug .pts format")
            ("mapping,p", po::value<fs::path>(&mappingsfile)->required()->default_value("../share/ibug_to_sfm.txt"),
                "landmark identifier to model vertex number mapping")
            ("model-contour,c", po::value<fs::path>(&contourfile)->required()->default_value("../share/model_contours.json"),
                "file with model contour indices")
            ("edge-topology,e", po::value<fs::path>(&edgetopologyfile)->required()->default_value("../share/sfm_3448_edge_topology.json"),
                "file with model's precomputed edge topology")
            ("blendshapes,b", po::value<fs::path>(&blendshapesfile)->required()->default_value("../share/expression_blendshapes_3448.bin"),
                "file with blendshapes")
            ("output,o", po::value<fs::path>(&outputfilebase)->required()->default_value("out"),
                "basename for the output rendering and obj files");
        // clang-format on
        po::variables_map vm;
        po::store(po::command_line_parser(argc, argv).options(desc).run(), vm);
        if (vm.count("help"))
        {
            cout << "Usage: fit-model-multi [options]" << endl;
            cout << desc;
            return EXIT_SUCCESS;
        }
        po::notify(vm);
    } catch (const po::error& e)
    {
        cout << "Error while parsing command-line arguments: " << e.what() << endl;
        cout << "Use --help to display a list of options." << endl;
        return EXIT_FAILURE;
    }

    if (landmarksfiles.size() != imagefiles.size()) {
        cout << "Number of landmarks files not equal to number of images given: " << landmarksfiles.size()
             << "!=" << imagefiles.size() << endl;
        return EXIT_FAILURE;
    }

    if (landmarksfiles.empty()) {
        cout << "Please give at least 1 image and landmark file." << endl;
        return EXIT_FAILURE;
    }
    // Load the image, landmarks, LandmarkMapper and the Morphable Model:
    vector<Mat> images;
    for (const auto& imagefile : imagefiles){
        images.push_back(cv::imread(imagefile.string()));
    }
    vector<LandmarkCollection<Eigen::Vector2f>> per_frame_landmarks;
    try
    {
        for (const auto& landmarksfile : landmarksfiles)
        {
            per_frame_landmarks.push_back(core::read_pts_landmarks(landmarksfile.string()));
        }
    } catch (const std::runtime_error& e)
    {
        cout << "Error reading the landmarks: " << e.what() << endl;
        return EXIT_FAILURE;
    }
    morphablemodel::MorphableModel morphable_model;
    try
    {
        morphable_model = morphablemodel::load_model(modelfile.string());
    } catch (const std::runtime_error& e)
    {
        cout << "Error loading the Morphable Model: " << e.what() << endl;
        return EXIT_FAILURE;
    }
    // The landmark mapper is used to map ibug landmark identifiers to vertex ids:
    core::LandmarkMapper landmark_mapper =
        mappingsfile.empty() ? core::LandmarkMapper() : core::LandmarkMapper(mappingsfile.string());

    // The expression blendshapes:
    vector<morphablemodel::Blendshape> blendshapes =
        morphablemodel::load_blendshapes(blendshapesfile.string());

    // These two are used to fit the front-facing contour to the ibug contour landmarks:
    fitting::ModelContour model_contour =
        contourfile.empty() ? fitting::ModelContour() : fitting::ModelContour::load(contourfile.string());
    fitting::ContourLandmarks ibug_contour = fitting::ContourLandmarks::load(mappingsfile.string());

    // The edge topology is used to speed up computation of the occluding face contour fitting:
    morphablemodel::EdgeTopology edge_topology =
        morphablemodel::load_edge_topology(edgetopologyfile.string());

    // Fit the model, get back a mesh and the pose:
    vector<core::Mesh> per_frame_meshes;
    vector<fitting::RenderingParameters> per_frame_rendering_params;
    vector<int> image_widths;
    vector<int> image_heights;
    for (const auto& image : images)
    {
        image_widths.push_back(image.cols);
        image_heights.push_back(image.rows);
    }

    vector<float> pca_shape_coefficients;
    vector<vector<float>> blendshape_coefficients;
    vector<vector<Eigen::Vector2f>> fitted_image_points;

    std::tie(per_frame_meshes, per_frame_rendering_params) = fitting::fit_shape_and_pose(
        morphable_model, blendshapes, per_frame_landmarks, landmark_mapper, image_widths, image_heights, edge_topology,
        ibug_contour, model_contour, 5, cpp17::nullopt, 30.0f, cpp17::nullopt, pca_shape_coefficients,
        blendshape_coefficients, fitted_image_points);

    cout << "Final pca shape coefficients: ";
    for (auto i : pca_shape_coefficients)
    {
        cout << i << ' ';
    }
    cout << endl;

    WeightedIsomapAveraging texturemap_averaging(60.f); // merge all triangles that are facing <60° towards the camera
    Mat merged_texturemap;
    for (unsigned i = 0; i < images.size(); ++i)
    {
        // The 3D head pose can be recovered as follows - the function returns an Eigen::Vector3f with yaw,
        // pitch, and roll angles:
        const float yaw_angle = per_frame_rendering_params[i].get_yaw_pitch_roll()[0];

        // Extract the texture from the image using given mesh and camera parameters:
        // Have to fiddle around with converting between core::Image and cv::Mat
        const core::Image4u texturemap = render::extract_texture(
            per_frame_meshes[i], per_frame_rendering_params[i].get_modelview(),
            per_frame_rendering_params[i].get_projection(), render::ProjectionType::Orthographic,
            core::from_mat_with_alpha(images[i]));

        // Draw the loaded landmarks:
        Mat outimg = images[i].clone();
        for (const auto& lm : per_frame_landmarks[i])
        {
            cv::rectangle(outimg, cv::Point2f(lm.coordinates[0] - 2.0f, lm.coordinates[1] - 2.0f),
                          cv::Point2f(lm.coordinates[0] + 2.0f, lm.coordinates[1] + 2.0f), {255, 0, 0});
        }

        // Draw the fitted mesh as wireframe, and save the image:
        render::draw_wireframe(outimg, per_frame_meshes[i], per_frame_rendering_params[i].get_modelview(),
                               per_frame_rendering_params[i].get_projection(),
                               fitting::get_opencv_viewport(images[i].cols, images[i].rows));
        fs::path outputfile = outputfilebase;
        outputfile += fs::path(imagefiles[i].stem());
        outputfile += fs::path(".png");
        cv::imwrite(outputfile.string(), outimg);

        // Save frontal rendering with texture:
        Eigen::Matrix4f modelview_frontal = Eigen::Matrix4f::Identity();
        core::Mesh neutral_expression = morphablemodel::sample_to_mesh(
            morphable_model.get_shape_model().draw_sample(pca_shape_coefficients),
            morphable_model.get_color_model().get_mean(),
            morphable_model.get_shape_model().get_triangle_list(),
            morphable_model.get_color_model().get_triangle_list(), morphable_model.get_texture_coordinates());
        const core::Image4u frontal_rendering = render::render(
            neutral_expression, modelview_frontal, render::ortho(-130.0f, 130.0f, -130.0f, 130.0f), 256, 256,
            render::create_mipmapped_texture(texturemap), true, false, false);
        outputfile.replace_extension(".frontal.png");
        cv::imwrite(outputfile.string(), core::to_mat(frontal_rendering));
        outputfile.replace_extension("");

        cv::Mat texturemap_opencv = core::to_mat(texturemap);

        // And save the texture map:
        outputfile.replace_extension(".texture.png");
        cv::imwrite(outputfile.string(), texturemap_opencv);

        // Merge the texture maps:
        merged_texturemap = texturemap_averaging.add_and_merge(texturemap_opencv);
    }

    // Save the merged texture map:
    fs::path outputfile = outputfilebase;
    outputfile += fs::path("merged.texture.png");
    cv::imwrite(outputfile.string(), merged_texturemap);
    outputfile.replace_extension("");

    // Save the frontal rendering with merged texture:
    Eigen::Matrix4f modelview_frontal = Eigen::Matrix4f::Identity();
    core::Mesh neutral_expression = morphablemodel::sample_to_mesh(
        morphable_model.get_shape_model().draw_sample(pca_shape_coefficients),
        morphable_model.get_color_model().get_mean(), morphable_model.get_shape_model().get_triangle_list(),
        morphable_model.get_color_model().get_triangle_list(), morphable_model.get_texture_coordinates());
    const core::Image4u frontal_rendering = render::render(
        neutral_expression, modelview_frontal, render::ortho(-130.0f, 130.0f, -130.0f, 130.0f), 512, 512,
        render::create_mipmapped_texture(core::from_mat_with_alpha(merged_texturemap)), true, false, false);
    outputfile.replace_extension(".frontal.png");
    cv::imwrite(outputfile.string(), core::to_mat(frontal_rendering));
    outputfile.replace_extension("");

    // Save the mesh as textured obj:
    outputfile.replace_extension(".obj");
    core::write_textured_obj(morphable_model.draw_sample(pca_shape_coefficients, std::vector<float>()),
                             outputfile.string());

    cout << "Finished fitting and wrote result mesh and texture to files with basename " << outputfilebase
         << "." << endl;

    return EXIT_SUCCESS;
}